

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_00;
  cmSourceFile *this_01;
  string tLocation;
  string depLocation;
  string name;
  undefined1 local_c0 [40];
  string local_98;
  string *local_78;
  string local_70;
  string local_50;
  
  cmsys::SystemTools::GetFilenameName(&local_70,inName);
  if (local_70._M_string_length == 0) {
LAB_001dc6de:
    bVar1 = false;
  }
  else {
    cmsys::SystemTools::GetFilenameLastExtension((string *)local_c0,&local_70);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,".exe");
    std::__cxx11::string::~string((string *)local_c0);
    if (bVar1) {
      cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_c0,&local_70);
      std::__cxx11::string::operator=((string *)&local_70,(string *)local_c0);
      std::__cxx11::string::~string((string *)local_c0);
    }
    this_00 = FindGeneratorTargetToUse(this,&local_70);
    if (this_00 != (cmGeneratorTarget *)0x0) {
      bVar1 = cmsys::SystemTools::FileIsFullPath(inName);
      if (bVar1) {
        local_c0._0_8_ = local_c0 + 0x10;
        local_c0._8_8_ = 0;
        local_c0[0x10] = '\0';
        TVar2 = cmGeneratorTarget::GetType(this_00);
        if (-1 < (int)TVar2) {
          TVar2 = cmGeneratorTarget::GetType(this_00);
          if ((int)TVar2 < 4) {
            cmGeneratorTarget::GetLocation(this_00,config);
            std::__cxx11::string::assign(local_c0);
            cmsys::SystemTools::GetFilenamePath(&local_98,(string *)local_c0);
            std::__cxx11::string::operator=((string *)local_c0,(string *)&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            cmsys::SystemTools::CollapseFullPath(&local_98,(string *)local_c0);
            std::__cxx11::string::operator=((string *)local_c0,(string *)&local_98);
            std::__cxx11::string::~string((string *)&local_98);
          }
        }
        std::__cxx11::string::string((string *)&local_50,(string *)inName);
        local_78 = config;
        cmsys::SystemTools::GetFilenamePath(&local_98,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        cmsys::SystemTools::CollapseFullPath(&local_50,&local_98);
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        bVar1 = std::operator!=(&local_98,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c0);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)dep);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)local_c0);
          bVar1 = true;
          goto LAB_001dc771;
        }
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)local_c0);
        config = local_78;
      }
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (TVar2 < (UNKNOWN_LIBRARY|STATIC_LIBRARY)) {
        if ((0x10fU >> (TVar2 & 0x1f) & 1) != 0) {
          cmGeneratorTarget::GetLocation(this_00,config);
          bVar1 = true;
          std::__cxx11::string::assign((char *)dep);
          goto LAB_001dc771;
        }
        goto LAB_001dc6de;
      }
    }
    bVar1 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar1) {
      bVar1 = true;
      std::__cxx11::string::_M_assign((string *)dep);
    }
    else {
      this_01 = cmMakefile::GetSource(this->Makefile,inName,Ambiguous);
      if (this_01 == (cmSourceFile *)0x0) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_c0,&this->StateSnapshot);
        cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_c0);
        std::__cxx11::string::_M_assign((string *)dep);
        std::__cxx11::string::append((char *)dep);
        bVar1 = true;
        std::__cxx11::string::append((string *)dep);
      }
      else {
        cmSourceFile::GetFullPath(this_01,(string *)0x0);
        bVar1 = true;
        std::__cxx11::string::_M_assign((string *)dep);
      }
    }
  }
LAB_001dc771:
  std::__cxx11::string::~string((string *)&local_70);
  return bVar1;
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if (name.empty()) {
    return false;
  }

  if (cmSystemTools::GetFilenameLastExtension(name) == ".exe") {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
  }

  // Look for a CMake target with the given name.
  if (cmGeneratorTarget* target = this->FindGeneratorTargetToUse(name)) {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if (cmSystemTools::FileIsFullPath(inName)) {
      std::string tLocation;
      if (target->GetType() >= cmStateEnums::EXECUTABLE &&
          target->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
      }
      std::string depLocation =
        cmSystemTools::GetFilenamePath(std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if (depLocation != tLocation) {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
      }
    }
    switch (target->GetType()) {
      case cmStateEnums::EXECUTABLE:
      case cmStateEnums::STATIC_LIBRARY:
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::UNKNOWN_LIBRARY:
        dep = target->GetLocation(config);
        return true;
      case cmStateEnums::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmStateEnums::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmStateEnums::UTILITY:
      case cmStateEnums::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
    }
  }

  // The name was not that of a CMake target.  It must name a file.
  if (cmSystemTools::FileIsFullPath(inName)) {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
  }

  // Check for a source file in this directory that matches the
  // dependency.
  if (cmSourceFile* sf = this->Makefile->GetSource(inName)) {
    dep = sf->GetFullPath();
    return true;
  }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = this->StateSnapshot.GetDirectory().GetCurrentSource();
  dep += "/";
  dep += inName;
  return true;
}